

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O3

void test_ADynArray_reserve_failure_growStrategyNull_fn(int _i)

{
  bool bVar1;
  char *pcVar2;
  char *expr;
  char **ppcVar3;
  int line;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  char *pcStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  size_t local_38;
  size_t local_30;
  size_t local_28;
  undefined8 *local_20;
  
  local_48 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_40 = private_ACUtilsTest_ADynArray_free;
  local_30 = 8;
  local_38 = 0;
  local_28 = 8;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_50 = 0x10bcca;
  local_20 = (undefined8 *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  *local_20 = 0x3035353535353535;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  uStack_50 = 0x10bcf6;
  bVar1 = private_ACUtils_ADynArray_reserve(&local_48,0x25,false,1);
  if (bVar1 == true) {
    uStack_50 = 0x10bd10;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x13e);
    if (local_30 == 8) {
      uStack_50 = 0x10bd30;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x13f);
      if (local_28 == 0x25) {
        uStack_50 = 0x10bd50;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x140);
        if (local_20 == (undefined8 *)0x0) {
          local_58 = 0;
          uStack_50 = 0;
          pcStack_60 = (char *)0x10bf34;
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x141,"Assertion \'_ck_x != NULL\' failed",
                            "Assertion \'%s\' failed: %s == %#x","(void*) array.buffer != NULL",
                            "(void*) array.buffer");
        }
        uStack_50 = 0x10bd70;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x141);
        lVar7 = 0;
        do {
          if ((long)*(char *)((long)local_20 + lVar7) != 0x35) {
            pcStack_60 = "\'5\'";
            pcVar2 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
            pcVar4 = "array.buffer[i] == \'5\'";
            pcVar5 = "array.buffer[i]";
            line = 0x143;
            local_58 = 0x35;
            sVar6 = (long)*(char *)((long)local_20 + lVar7);
            goto LAB_0010be49;
          }
          uStack_50 = 0x10bd94;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x143);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 7);
        if ((long)*(char *)((long)local_20 + 7) == 0x30) {
          uStack_50 = 0x10bdc2;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x144);
          if (local_38 != 0) {
            expr = "Assertion \'_ck_x == NULL\' failed";
            pcVar2 = "Assertion \'%s\' failed: %s == %#x";
            pcVar4 = "(void*) array.growStrategy == NULL";
            pcVar5 = "(void*) array.growStrategy";
            line = 0x145;
            ppcVar3 = (char **)&uStack_50;
            sVar6 = local_38;
            goto LAB_0010be4b;
          }
          uStack_50 = 0x10bde1;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x145);
          if (private_ACUtilsTest_ADynArray_reallocCount == 1) {
            uStack_50 = 0x10be03;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x146);
            uStack_50 = 0x10be0c;
            (*pcStack_40)(local_20);
            return;
          }
          pcStack_60 = "1";
          pcVar4 = "private_ACUtilsTest_ADynArray_reallocCount == 1";
          pcVar5 = "private_ACUtilsTest_ADynArray_reallocCount";
          line = 0x146;
          sVar6 = private_ACUtilsTest_ADynArray_reallocCount;
          goto LAB_0010bfc7;
        }
        pcStack_60 = "\'0\'";
        pcVar2 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
        pcVar4 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1] == \'0\'";
        pcVar5 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1]";
        line = 0x144;
        local_58 = 0x30;
        sVar6 = (long)*(char *)((long)local_20 + 7);
      }
      else {
        pcStack_60 = "private_ACUtilsTest_ADynArray_capacityMax + 5";
        pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar4 = "array.capacity == private_ACUtilsTest_ADynArray_capacityMax + 5";
        pcVar5 = "array.capacity";
        line = 0x140;
        local_58 = 0x25;
        sVar6 = local_28;
      }
    }
    else {
      pcStack_60 = "private_ACUtilsTest_ADynArray_capacityMin";
      pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar4 = "array.size == private_ACUtilsTest_ADynArray_capacityMin";
      pcVar5 = "array.size";
      line = 0x13f;
      local_58 = 8;
      sVar6 = local_30;
    }
  }
  else {
    sVar6 = (size_t)bVar1;
    pcStack_60 = "true";
    pcVar4 = 
    "private_ACUtils_ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax + 5, false, sizeof(*(&array)->buffer)) == true"
    ;
    pcVar5 = 
    "private_ACUtils_ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax + 5, false, sizeof(*(&array)->buffer))"
    ;
    line = 0x13e;
LAB_0010bfc7:
    pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    local_58 = 1;
  }
LAB_0010be49:
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  ppcVar3 = &pcStack_60;
LAB_0010be4b:
  uStack_50 = 0;
  *(size_t *)((long)ppcVar3 + -8) = sVar6;
  *(undefined8 *)((long)ppcVar3 + -0x10) = 0x10be52;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,line,expr,pcVar2,pcVar4,pcVar5);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_reserve_failure_growStrategyNull)
{
    size_t i;
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = private_ACUtilsTest_ADynArray_capacityMin;
    array.growStrategy = nullptr;
    array.capacity = private_ACUtilsTest_ADynArray_capacityMin;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    for(i = 0; i < array.size - 1; ++i)
        array.buffer[i] = '5';
    array.buffer[array.size - 1] = '0';
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax + 5), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, private_ACUtilsTest_ADynArray_capacityMax + 5);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    for(i = 0; i < private_ACUtilsTest_ADynArray_capacityMin - 1; ++i)
        ACUTILSTEST_ASSERT_INT_EQ(array.buffer[i], '5');
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1], '0');
    ACUTILSTEST_ASSERT_PTR_NULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 1);
    array.deallocator(array.buffer);
}